

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeRef * __thiscall c4::yml::Tree::ref(NodeRef *__return_storage_ptr__,Tree *this,size_t id)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  NodeRef *pNVar5;
  csubstr cVar6;
  char *pcStack_68;
  size_t local_60;
  char msg [53];
  
  if ((id == 0xffffffffffffffff) || (this->m_size <= id)) {
    builtin_strncpy(msg,"check failed: (id != NONE && id >= 0 && id < m_size)",0x35);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        pNVar5 = (NodeRef *)(*pcVar2)();
        return pNVar5;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_60 = cVar6.len;
    pcStack_68 = cVar6.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6258) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6258) << 0x40,8);
    LVar3.name.str = pcStack_68;
    LVar3.name.len = local_60;
    (*p_Var1)(msg,0x35,LVar3,(this->m_callbacks).m_user_data);
  }
  __return_storage_ptr__->m_tree = this;
  __return_storage_ptr__->m_id = id;
  (__return_storage_ptr__->m_seed).str = (char *)0x0;
  (__return_storage_ptr__->m_seed).len = 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::ref(size_t id)
{
    _RYML_CB_ASSERT(m_callbacks, id != NONE && id >= 0 && id < m_size);
    return NodeRef(this, id);
}